

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O0

Term * __thiscall
FMB::FiniteModelMultiSorted::getDomainConstant(FiniteModelMultiSorted *this,uint c,uint srt)

{
  bool bVar1;
  DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *this_00;
  Term *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_00000008;
  char *in_stack_00000010;
  uint in_stack_0000001c;
  Signature *in_stack_00000020;
  TermList srtT;
  uint f;
  string name;
  pair<unsigned_int,_unsigned_int> pair;
  Term *t;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  TermList in_stack_fffffffffffffee0;
  DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffee8;
  pair<unsigned_int,_unsigned_int> key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  string local_b8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68 [32];
  string local_48 [32];
  pair<unsigned_int,_unsigned_int> local_28;
  Term *local_20;
  Term *local_8;
  
  local_28 = std::make_pair<unsigned_int&,unsigned_int&>
                       ((uint *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        (uint *)0x2db8df);
  bVar1 = Lib::
          DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::find(in_stack_fffffffffffffee8,
                 (pair<unsigned_int,_unsigned_int> *)in_stack_fffffffffffffee0._content,
                 (Term **)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (bVar1) {
    local_8 = local_20;
  }
  else {
    Kernel::Signature::typeConName_abi_cxx11_
              ((Signature *)in_stack_fffffffffffffee0._content,in_stack_fffffffffffffedc);
    __rhs = &local_88;
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0._content);
    Lib::Int::toString_abi_cxx11_(in_stack_0000001c);
    std::operator+(in_RDI,__rhs);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string((string *)&local_88);
    key = DAT_01333830;
    std::__cxx11::string::c_str();
    Kernel::Signature::addFreshFunction
              (in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_00000008);
    this_00 = (DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
               *)Kernel::AtomicSort::createConstant(0);
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffee0._content,
               (Term *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    Kernel::Signature::getFunction
              ((Signature *)in_stack_fffffffffffffee0._content,in_stack_fffffffffffffedc);
    val = (Term *)Kernel::OperatorType::getConstantsType
                            (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    Kernel::Signature::Symbol::setType
              ((Symbol *)in_stack_fffffffffffffee0._content,
               (OperatorType *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_20 = Kernel::Term::createConstant(0);
    Lib::
    DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::insert(this_00,key,val);
    Lib::
    DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::insert((DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
              *)this_00,val,key);
    local_8 = local_20;
    std::__cxx11::string::~string(local_48);
  }
  return local_8;
}

Assistant:

Term* getDomainConstant(unsigned c, unsigned srt)
  {
    Term* t;
    std::pair<unsigned,unsigned> pair = std::make_pair(c,srt);
    if(_domainConstants.find(pair,t)) return t;
    std::string name = "domCon_"+env.signature->typeConName(srt)+"_"+Lib::Int::toString(c);
    unsigned f = env.signature->addFreshFunction(0,name.c_str());
    TermList srtT = TermList(AtomicSort::createConstant(srt));
    env.signature->getFunction(f)->setType(OperatorType::getConstantsType(srtT));
    t = Term::createConstant(f);
    _domainConstants.insert(pair,t);
    _domainConstantsRev.insert(t,pair);

    return t;
  }